

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

int __thiscall rr::TriangleRasterizer::init(TriangleRasterizer *this,EVP_PKEY_CTX *ctx)

{
  deInt32 dVar1;
  int iVar2;
  int a;
  int iVar3;
  int iVar4;
  int iVar5;
  deInt64 x1_00;
  deInt64 y1_00;
  deInt64 x0_00;
  deInt64 y0_00;
  deInt64 x0_01;
  deInt64 y0_01;
  deInt64 dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  Vector<float,_4> *in_RCX;
  Vector<float,_4> *in_RDX;
  bool bVar12;
  float fVar13;
  int wY1;
  int wX1;
  int wY0;
  int wX0;
  deInt64 yMax;
  deInt64 yMin;
  deInt64 xMax;
  deInt64 xMin;
  bool positiveArea;
  deInt64 s;
  deInt64 y2;
  deInt64 x2;
  deInt64 y1;
  deInt64 x1;
  deInt64 y0;
  deInt64 x0;
  Vec4 *v2_local;
  Vec4 *v1_local;
  Vec4 *v0_local;
  TriangleRasterizer *this_local;
  
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX->m_data;
  *(undefined8 *)((this->m_v1).m_data + 2) = *(undefined8 *)(in_RDX->m_data + 2);
  *(undefined8 *)(this->m_v2).m_data = *(undefined8 *)in_RCX->m_data;
  *(undefined8 *)((this->m_v2).m_data + 2) = *(undefined8 *)(in_RCX->m_data + 2);
  fVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)ctx);
  x1_00 = toSubpixelCoord(fVar13);
  fVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)ctx);
  y1_00 = toSubpixelCoord(fVar13);
  fVar13 = tcu::Vector<float,_4>::x(in_RDX);
  x0_00 = toSubpixelCoord(fVar13);
  fVar13 = tcu::Vector<float,_4>::y(in_RDX);
  y0_00 = toSubpixelCoord(fVar13);
  fVar13 = tcu::Vector<float,_4>::x(in_RCX);
  x0_01 = toSubpixelCoord(fVar13);
  fVar13 = tcu::Vector<float,_4>::y(in_RCX);
  y0_01 = toSubpixelCoord(fVar13);
  if (this->m_winding == WINDING_CCW) {
    initEdgeCCW(&this->m_edge01,this->m_horizontalFill,this->m_verticalFill,x1_00,y1_00,x0_00,y0_00)
    ;
    initEdgeCCW(&this->m_edge12,this->m_horizontalFill,this->m_verticalFill,x0_00,y0_00,x0_01,y0_01)
    ;
    initEdgeCCW(&this->m_edge20,this->m_horizontalFill,this->m_verticalFill,x0_01,y0_01,x1_00,y1_00)
    ;
  }
  else {
    initEdgeCCW(&this->m_edge01,this->m_horizontalFill,this->m_verticalFill,x0_00,y0_00,x1_00,y1_00)
    ;
    initEdgeCCW(&this->m_edge12,this->m_horizontalFill,this->m_verticalFill,x0_01,y0_01,x0_00,y0_00)
    ;
    initEdgeCCW(&this->m_edge20,this->m_horizontalFill,this->m_verticalFill,x1_00,y1_00,x0_01,y0_01)
    ;
  }
  dVar6 = evaluateEdge(&this->m_edge01,x0_01,y0_01);
  if (this->m_winding == WINDING_CCW) {
    bVar12 = 0 < dVar6;
  }
  else {
    bVar12 = dVar6 < 0;
  }
  if (this->m_viewportOrientation == VIEWPORTORIENTATION_UPPER_LEFT) {
    this->m_face = (uint)bVar12;
  }
  else {
    this->m_face = (uint)!bVar12;
  }
  if (!bVar12) {
    reverseEdge(&this->m_edge01);
    reverseEdge(&this->m_edge12);
    reverseEdge(&this->m_edge20);
  }
  lVar7 = de::min<long>(x1_00,x0_00);
  lVar7 = de::min<long>(lVar7,x0_01);
  lVar8 = de::max<long>(x1_00,x0_00);
  lVar8 = de::max<long>(lVar8,x0_01);
  lVar9 = de::min<long>(y1_00,y0_00);
  lVar9 = de::min<long>(lVar9,y0_01);
  lVar10 = de::max<long>(y1_00,y0_00);
  lVar10 = de::max<long>(lVar10,y0_01);
  dVar1 = floorSubpixelToPixelCoord(lVar7,this->m_horizontalFill == FILL_LEFT);
  piVar11 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
  *piVar11 = dVar1;
  dVar1 = floorSubpixelToPixelCoord(lVar9,this->m_verticalFill == FILL_BOTTOM);
  piVar11 = tcu::Vector<int,_2>::y(&this->m_bboxMin);
  *piVar11 = dVar1;
  dVar1 = ceilSubpixelToPixelCoord(lVar8,this->m_horizontalFill == FILL_RIGHT);
  piVar11 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
  *piVar11 = dVar1;
  dVar1 = ceilSubpixelToPixelCoord(lVar10,this->m_verticalFill == FILL_TOP);
  piVar11 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
  *piVar11 = dVar1;
  iVar2 = tcu::Vector<int,_4>::x(&this->m_viewport);
  a = tcu::Vector<int,_4>::y(&this->m_viewport);
  iVar3 = tcu::Vector<int,_4>::z(&this->m_viewport);
  iVar3 = iVar2 + iVar3 + -1;
  iVar4 = tcu::Vector<int,_4>::w(&this->m_viewport);
  iVar4 = a + iVar4 + -1;
  piVar11 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
  iVar5 = de::clamp<int>(*piVar11,iVar2,iVar3);
  piVar11 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
  *piVar11 = iVar5;
  piVar11 = tcu::Vector<int,_2>::y(&this->m_bboxMin);
  iVar5 = de::clamp<int>(*piVar11,a,iVar4);
  piVar11 = tcu::Vector<int,_2>::y(&this->m_bboxMin);
  *piVar11 = iVar5;
  piVar11 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
  iVar2 = de::clamp<int>(*piVar11,iVar2,iVar3);
  piVar11 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
  *piVar11 = iVar2;
  piVar11 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
  iVar2 = de::clamp<int>(*piVar11,a,iVar4);
  piVar11 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
  *piVar11 = iVar2;
  *(undefined8 *)(this->m_curPos).m_data = *(undefined8 *)(this->m_bboxMin).m_data;
  return (int)this;
}

Assistant:

void TriangleRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, const tcu::Vec4& v2)
{
	m_v0 = v0;
	m_v1 = v1;
	m_v2 = v2;

	// Positions in fixed-point coordinates.
	const deInt64	x0		= toSubpixelCoord(v0.x());
	const deInt64	y0		= toSubpixelCoord(v0.y());
	const deInt64	x1		= toSubpixelCoord(v1.x());
	const deInt64	y1		= toSubpixelCoord(v1.y());
	const deInt64	x2		= toSubpixelCoord(v2.x());
	const deInt64	y2		= toSubpixelCoord(v2.y());

	// Initialize edge functions.
	if (m_winding == WINDING_CCW)
	{
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x0, y0, x1, y1);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x1, y1, x2, y2);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x2, y2, x0, y0);
	}
	else
	{
		// Reverse edges
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x1, y1, x0, y0);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x2, y2, x1, y1);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x0, y0, x2, y2);
	}

	// Determine face.
	const deInt64	s				= evaluateEdge(m_edge01, x2, y2);
	const bool		positiveArea	= (m_winding == WINDING_CCW) ? (s > 0) : (s < 0);

	if (m_viewportOrientation == VIEWPORTORIENTATION_UPPER_LEFT)
		m_face = positiveArea ? FACETYPE_BACK : FACETYPE_FRONT;
	else
		m_face = positiveArea ? FACETYPE_FRONT : FACETYPE_BACK;

	if (!positiveArea)
	{
		// Reverse edges so that we can use CCW area tests & interpolation
		reverseEdge(m_edge01);
		reverseEdge(m_edge12);
		reverseEdge(m_edge20);
	}

	// Bounding box
	const deInt64	xMin	= de::min(de::min(x0, x1), x2);
	const deInt64	xMax	= de::max(de::max(x0, x1), x2);
	const deInt64	yMin	= de::min(de::min(y0, y1), y2);
	const deInt64	yMax	= de::max(de::max(y0, y1), y2);

	m_bboxMin.x() = floorSubpixelToPixelCoord	(xMin, m_horizontalFill	== FILL_LEFT);
	m_bboxMin.y() = floorSubpixelToPixelCoord	(yMin, m_verticalFill	== FILL_BOTTOM);
	m_bboxMax.x() = ceilSubpixelToPixelCoord	(xMax, m_horizontalFill	== FILL_RIGHT);
	m_bboxMax.y() = ceilSubpixelToPixelCoord	(yMax, m_verticalFill	== FILL_TOP);

	// Clamp to viewport
	const int		wX0		= m_viewport.x();
	const int		wY0		= m_viewport.y();
	const int		wX1		= wX0 + m_viewport.z() - 1;
	const int		wY1		= wY0 + m_viewport.w() -1;

	m_bboxMin.x() = de::clamp(m_bboxMin.x(), wX0, wX1);
	m_bboxMin.y() = de::clamp(m_bboxMin.y(), wY0, wY1);
	m_bboxMax.x() = de::clamp(m_bboxMax.x(), wX0, wX1);
	m_bboxMax.y() = de::clamp(m_bboxMax.y(), wY0, wY1);

	m_curPos = m_bboxMin;
}